

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Downloader_libcurl::download
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL,string *path,
          bool neededWriteBack)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  uint __uval;
  uint uVar5;
  undefined3 in_register_00000081;
  bool bVar6;
  long lVar7;
  string output;
  string fileName;
  string __str;
  char *local_2b0;
  long local_2a8;
  char local_2a0;
  undefined7 uStack_29f;
  undefined4 local_28c;
  string local_288;
  undefined8 local_268;
  char *local_260;
  string *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char *local_230;
  undefined8 local_228;
  char local_220;
  undefined7 uStack_21f;
  ios_base local_138 [264];
  
  local_28c = CONCAT31(in_register_00000081,neededWriteBack);
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_258 = path;
  getFileNameFromURL(&local_288,this,downloadURL);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  local_228 = 0;
  local_220 = '\0';
  local_230 = &local_220;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,(string *)&local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  uVar3 = curl_easy_init();
  curl_easy_setopt(uVar3,0x2712,(downloadURL->_M_dataplus)._M_p);
  curl_easy_setopt(uVar3,0x4e2b,fetchDownloadedData);
  curl_easy_setopt(uVar3,0x14,10);
  curl_easy_setopt(uVar3,0x13,0x400);
  local_2b0 = &local_2a0;
  local_2a8 = 0;
  local_2a0 = '\0';
  local_260 = _VTT;
  local_268 = ___cxa_allocate_exception;
  bVar6 = true;
  uVar5 = 0;
  do {
    if (uVar5 < 8) {
      std::__cxx11::string::append((char *)&local_2b0);
      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_288._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_2b0);
      local_230 = &local_220;
      std::__cxx11::string::_M_construct((ulong)&local_230,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230,1,uVar5 + 1);
      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
      }
      std::__cxx11::string::append((char *)&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_2b0,local_2a8);
      local_2a8 = 0;
      *local_2b0 = '\0';
      piVar4 = (int *)operator_new(0x10);
      piVar4[0] = 0;
      piVar4[1] = 1;
      piVar4[2] = 0;
      piVar4[3] = 0;
      curl_easy_setopt(uVar3,0x2711,piVar4);
      iVar2 = curl_easy_perform(uVar3);
      if (iVar2 == 0) {
        std::__cxx11::string::append((char *)&local_2b0);
        std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_288._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_2b0,local_2a8);
        local_2a8 = 0;
        *local_2b0 = '\0';
        if (0 < *piVar4) {
          lVar7 = 0;
          do {
            std::__cxx11::string::push_back((char)&__return_storage_ptr__->second);
            lVar7 = lVar7 + 1;
          } while (lVar7 < *piVar4);
        }
        if ((char)local_28c != '\0') {
          std::operator+(&local_250,local_258,&__return_storage_ptr__->first);
          std::ofstream::ofstream(&local_230,(string *)&local_250,_S_out|_S_bin);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 != '\0') {
            std::ostream::write((char *)&local_230,
                                (long)(__return_storage_ptr__->second)._M_dataplus._M_p);
          }
          std::ofstream::close();
          local_230 = local_260;
          *(undefined8 *)((long)&local_230 + *(long *)(local_260 + -0x18)) = local_268;
          std::filebuf::~filebuf((filebuf *)&local_228);
          std::ios_base::~ios_base(local_138);
        }
        bVar6 = false;
      }
      operator_delete(piVar4,0x10);
    }
    else {
      std::__cxx11::string::append((char *)&local_2b0);
      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_288._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_2b0,local_2a8);
      local_2a8 = 0;
      *local_2b0 = '\0';
      bVar6 = false;
    }
    uVar5 = uVar5 + 1;
  } while (bVar6);
  curl_easy_cleanup(uVar3);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> Downloader_libcurl::download(const std::string &downloadURL, const std::string &path, bool neededWriteBack)
{
    auto ret = std::pair<std::string, std::string>();

    auto fileName = this->getFileNameFromURL(downloadURL);

    ret.first = fileName;
    ret.second = std::string();

    //curl environment setup
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, downloadURL.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, this->fetchDownloadedData);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, lowSpeedTimeout);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, lowSpeedBound);

    bool needTry = true;

    int retryCount = 0;
    auto output = std::string();

    while(needTry)
    {
        retryCount++;

        if(retryCount > retryLimit)
        {
            output += "Retry limit exceeded: ";
            output += fileName;
            output += ", download failed\n";
            std::cout << output;
            output.clear();
            needTry = false;
            continue;
        }

        output += "Downloading ";
        output += fileName;
        output += ", retry counter: ";
        output += std::to_string(retryCount);
        output += "\n";
        std::cout << output;
        output.clear();

        //temporary storage allocation
        auto *buf = new memBlockStruc {0, 1, nullptr};

        //download part
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)buf);
        auto err = curl_easy_perform(curl);

        //needTry comes false when download completed or retry limit exceeded
        if(err == CURLE_OK)
        {
            output += "Downloaded ";
            output += fileName;
            output += "\n";
            std::cout << output;
            output.clear();

            for(int i = 0; i < buf->realSize; i++) ret.second += buf->memBlock[i];
            needTry = false;

            if(neededWriteBack)
            {
                std::ofstream fout(path + ret.first, std::ios::out | std::ios::binary);
                if (fout.is_open()) fout.write(ret.second.c_str(), ret.second.length());
                fout.close();
            }
        }

        //temporary storage release
        delete buf;
    }

    //curl exit
    curl_easy_cleanup(curl);

    //return
    return ret;
}